

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opl_mus_player.cpp
# Opt level: O2

int __thiscall OPLmusicFile::PlayTick(OPLmusicFile *this)

{
  musicBlock *pmVar1;
  uint *puVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  ushort uVar6;
  int iVar7;
  uint uVar8;
  byte *pbVar9;
  BYTE *pBVar10;
  OPLio *pOVar11;
  uint *puVar12;
  byte *pbVar13;
  BYTE *pBVar14;
  byte bVar15;
  byte bVar16;
  uint uVar17;
  long lVar18;
  
  switch(this->RawPlayer) {
  case RDosPlay:
    do {
      while( true ) {
        pbVar9 = (this->super_OPLmusicBlock).super_musicBlock.score;
        if ((this->super_OPLmusicBlock).super_musicBlock.scoredata + this->ScoreLen <= pbVar9) {
          return 0;
        }
        (this->super_OPLmusicBlock).super_musicBlock.score = pbVar9 + 1;
        bVar15 = *pbVar9;
        (this->super_OPLmusicBlock).super_musicBlock.score = pbVar9 + 2;
        bVar3 = pbVar9[1];
        if (bVar3 == 0xff) break;
        if (bVar3 == 2) {
          if (bVar15 == 2) {
            this->WhichChip = 1;
          }
          else if (bVar15 == 1) {
            this->WhichChip = 0;
          }
          else if (bVar15 == 0) {
            (this->super_OPLmusicBlock).SamplesPerTick =
                 (double)*(ushort *)(pbVar9 + 2) * 0.041666666666666664;
            (*((this->super_OPLmusicBlock).super_musicBlock.io)->_vptr_OPLio[5])();
            pmVar1 = &(this->super_OPLmusicBlock).super_musicBlock;
            pmVar1->score = pmVar1->score + 2;
          }
        }
        else if (bVar3 == 0) {
          if (bVar15 != 0) {
            return (uint)bVar15;
          }
        }
        else {
          pOVar11 = (this->super_OPLmusicBlock).super_musicBlock.io;
          (*pOVar11->_vptr_OPLio[4])(pOVar11,(ulong)(uint)this->WhichChip);
        }
      }
    } while (bVar15 != 0xff);
    break;
  case IMF:
    uVar17 = 0;
    while( true ) {
      if ((short)uVar17 != 0) {
        return uVar17;
      }
      puVar12 = (uint *)(this->super_OPLmusicBlock).super_musicBlock.score;
      puVar2 = puVar12 + 1;
      if ((long)this->ScoreLen <
          (long)puVar2 - (long)(this->super_OPLmusicBlock).super_musicBlock.scoredata) break;
      uVar8 = *puVar12;
      if (uVar8 == 0xffffffff) {
        return 0;
      }
      uVar17 = uVar8 >> 0x10;
      (this->super_OPLmusicBlock).super_musicBlock.score = (BYTE *)puVar2;
      pOVar11 = (this->super_OPLmusicBlock).super_musicBlock.io;
      (*pOVar11->_vptr_OPLio[4])(pOVar11,0,(ulong)(uVar8 & 0xff));
    }
    return 0;
  case DosBox1:
    while (pbVar9 = (this->super_OPLmusicBlock).super_musicBlock.score,
          pbVar9 < (this->super_OPLmusicBlock).super_musicBlock.scoredata + this->ScoreLen) {
      pbVar13 = pbVar9 + 1;
      (this->super_OPLmusicBlock).super_musicBlock.score = pbVar13;
      bVar15 = *pbVar9;
      lVar18 = 2;
      switch(bVar15) {
      case 0:
        (this->super_OPLmusicBlock).super_musicBlock.score = pbVar9 + 2;
        bVar15 = pbVar9[1];
LAB_003548c4:
        return bVar15 + 1;
      case 1:
        uVar6 = *(ushort *)(pbVar9 + 1);
        (this->super_OPLmusicBlock).super_musicBlock.score = pbVar9 + 3;
        return uVar6 + 1;
      case 2:
        this->WhichChip = 0;
        break;
      case 3:
        this->WhichChip = 1;
        break;
      case 4:
        pbVar13 = pbVar9 + 2;
        (this->super_OPLmusicBlock).super_musicBlock.score = pbVar13;
        bVar15 = pbVar9[1];
        lVar18 = 3;
      default:
        (this->super_OPLmusicBlock).super_musicBlock.score = pbVar9 + lVar18;
        pOVar11 = (this->super_OPLmusicBlock).super_musicBlock.io;
        (*pOVar11->_vptr_OPLio[4])
                  (pOVar11,(ulong)(uint)this->WhichChip,(ulong)bVar15,(ulong)*pbVar13);
      }
    }
    break;
  case DosBox2:
    pBVar10 = (this->super_OPLmusicBlock).super_musicBlock.scoredata;
    bVar15 = pBVar10[0x19];
    bVar3 = pBVar10[0x17];
    bVar4 = pBVar10[0x18];
    pBVar14 = pBVar10;
    do {
      iVar7 = this->ScoreLen;
      pbVar9 = (this->super_OPLmusicBlock).super_musicBlock.score;
      do {
        pbVar13 = pbVar9;
        if (pBVar14 + iVar7 <= pbVar13) {
          return 0;
        }
        (this->super_OPLmusicBlock).super_musicBlock.score = pbVar13 + 1;
        bVar5 = *pbVar13;
        (this->super_OPLmusicBlock).super_musicBlock.score = pbVar13 + 2;
        uVar17 = bVar5 & 0x7f;
        bVar16 = (byte)uVar17;
        if (bVar16 == bVar3) {
          bVar15 = pbVar13[1];
          goto LAB_003548c4;
        }
        if (bVar16 == bVar4) {
          return (uint)pbVar13[1] * 0x100 + 0x100;
        }
        pbVar9 = pbVar13 + 2;
      } while (bVar15 <= bVar16);
      pOVar11 = (this->super_OPLmusicBlock).super_musicBlock.io;
      (*pOVar11->_vptr_OPLio[4])
                (pOVar11,(ulong)(bVar5 >> 7),(ulong)pBVar10[(ulong)uVar17 + 0x1a],(ulong)pbVar13[1])
      ;
      pBVar14 = (this->super_OPLmusicBlock).super_musicBlock.scoredata;
    } while( true );
  default:
    return 0;
  }
  return 0;
}

Assistant:

int OPLmusicFile::PlayTick ()
{
	BYTE reg, data;
	WORD delay;

	switch (RawPlayer)
	{
	case RDosPlay:
		while (score < scoredata + ScoreLen)
		{
			data = *score++;
			reg = *score++;
			switch (reg)
			{
			case 0:		// Delay
				if (data != 0)
				{
					return data;
				}
				break;

			case 2:		// Speed change or OPL3 switch
				if (data == 0)
				{
					SamplesPerTick = LittleShort(*(WORD *)(score)) / ADLIB_CLOCK_MUL;
					io->SetClockRate(SamplesPerTick);
					score += 2;
				}
				else if (data == 1)
				{
					WhichChip = 0;
				}
				else if (data == 2)
				{
					WhichChip = 1;
				}
				break;

			case 0xFF:	// End of song
				if (data == 0xFF)
				{
					return 0;
				}
				break;

			default:	// It's something to stuff into the OPL chip
				io->OPLwriteReg(WhichChip, reg, data);
				break;
			}
		}
		break;

	case DosBox1:
		while (score < scoredata + ScoreLen)
		{
			reg = *score++;

			if (reg == 4)
			{
				reg = *score++;
				data = *score++;
			}
			else if (reg == 0)
			{ // One-byte delay
				return *score++ + 1;
			}
			else if (reg == 1)
			{ // Two-byte delay
				int delay = score[0] + (score[1] << 8) + 1;
				score += 2;
				return delay;
			}
			else if (reg == 2)
			{ // Select OPL chip 0
				WhichChip = 0;
				continue;
			}
			else if (reg == 3)
			{ // Select OPL chip 1
				WhichChip = 1;
				continue;
			}
			else
			{
				data = *score++;
			}
			io->OPLwriteReg(WhichChip, reg, data);
		}
		break;

	case DosBox2:
		{
			BYTE *to_reg = scoredata + 0x1A;
			BYTE to_reg_size = scoredata[0x19];
			BYTE short_delay_code = scoredata[0x17];
			BYTE long_delay_code = scoredata[0x18];

			while (score < scoredata + ScoreLen)
			{
				BYTE code = *score++;
				data = *score++;

				// Which OPL chip to write to is encoded in the high bit of the code value.
				int which = !!(code & 0x80);
				code &= 0x7F;

				if (code == short_delay_code)
				{
					return data + 1;
				}
				else if (code == long_delay_code)
				{
					return (data + 1) << 8;
				}
				else if (code < to_reg_size)
				{
					io->OPLwriteReg(which, to_reg[code], data);
				}
			}
		}
		break;

	case IMF:
		delay = 0;
		while (delay == 0 && score + 4 - scoredata <= ScoreLen)
		{
			if (*(DWORD *)score == 0xFFFFFFFF)
			{ // This is a special value that means to end the song.
				return 0;
			}
			reg = score[0];
			data = score[1];
			delay = LittleShort(((WORD *)score)[1]);
			score += 4;
			io->OPLwriteReg (0, reg, data);
		}
		return delay;
	}
	return 0;
}